

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
duckdb::LogicalVacuum::Deserialize(Deserializer *deserializer)

{
  void *pvVar1;
  pointer pBVar2;
  undefined8 uVar3;
  TableCatalogEntry *table_p;
  TableRef *in_RSI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> in_RDI;
  TableCatalogEntry *table;
  unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true> ref;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> bound_table;
  shared_ptr<duckdb::Binder,_true> binder;
  ClientContext *context;
  VacuumInfo *info;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> tmp_info;
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> result;
  pointer in_stack_fffffffffffffea8;
  pointer in_stack_fffffffffffffeb0;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
  *in_stack_fffffffffffffeb8;
  LogicalVacuum *this;
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  field_id_t field_id;
  Deserializer *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  field_id_t field_id_00;
  Deserializer *in_stack_ffffffffffffff00;
  BinderType binder_type;
  ClientContext *in_stack_ffffffffffffff50;
  optional_ptr<duckdb::Binder,_true> in_stack_ffffffffffffff58;
  string local_90 [40];
  optional_ptr<duckdb::Binder,_true> local_68 [3];
  ClientContext *local_50;
  type local_48;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> this_00;
  
  field_id_00 = (field_id_t)((ulong)in_stack_fffffffffffffef8 >> 0x30);
  field_id = (field_id_t)((ulong)in_stack_fffffffffffffee0 >> 0x30);
  this_00._M_head_impl =
       (LogicalOperator *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  pvVar1 = operator_new(0xb0);
  binder_type = (BinderType)((ulong)pvVar1 >> 0x38);
  LogicalVacuum(in_stack_fffffffffffffeb0);
  unique_ptr<duckdb::LogicalVacuum,std::default_delete<duckdb::LogicalVacuum>,true>::
  unique_ptr<std::default_delete<duckdb::LogicalVacuum>,void>
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            (in_stack_fffffffffffffee8,field_id,in_stack_fffffffffffffed8);
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::operator->
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             in_stack_fffffffffffffeb0);
  Deserializer::
  ReadProperty<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            (in_stack_ffffffffffffff00,field_id_00,in_stack_fffffffffffffef0,
             (unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)in_stack_fffffffffffffee8);
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             in_stack_fffffffffffffeb0,
             (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             in_stack_fffffffffffffea8);
  unique_ptr_cast<duckdb::ParseInfo,duckdb::VacuumInfo>
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             in_stack_fffffffffffffeb8);
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::operator->
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             in_stack_fffffffffffffeb0);
  unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator=
            ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *)
             in_stack_fffffffffffffeb0,
             (unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *)
             in_stack_fffffffffffffea8);
  unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true> *)
             0xe63789);
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)0xe63796
            );
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::operator->
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             in_stack_fffffffffffffeb0);
  local_48 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::
             operator*((unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>
                        *)in_stack_fffffffffffffeb0);
  if ((local_48->has_table & 1U) != 0) {
    local_50 = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)0xe637ee);
    optional_ptr<duckdb::Binder,_true>::optional_ptr(local_68,(Binder *)0x0);
    Binder::CreateBinder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,binder_type);
    shared_ptr<duckdb::Binder,_true>::operator->
              ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffeb0);
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
              ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
               in_stack_fffffffffffffeb0);
    Binder::Bind((Binder *)this_00._M_head_impl,in_RSI);
    pBVar2 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)in_stack_fffffffffffffeb0);
    if (pBVar2->type != BASE_TABLE) {
      uVar3 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_90,"can only vacuum or analyze base tables",
                 (allocator *)&stack0xffffffffffffff6f);
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)in_stack_fffffffffffffeb0,
                 (string *)in_stack_fffffffffffffea8);
      __cxa_throw(uVar3,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    this = (LogicalVacuum *)&stack0xffffffffffffff58;
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::unique_ptr
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)in_stack_fffffffffffffeb0,
               (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)in_stack_fffffffffffffea8);
    unique_ptr_cast<duckdb::BoundTableRef,duckdb::BoundBaseTableRef>(in_stack_fffffffffffffeb8);
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)0xe63a92);
    table_p = (TableCatalogEntry *)
              unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
              ::operator->((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                            *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffeb0 =
         unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
         operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                     *)in_stack_fffffffffffffeb0);
    SetTable(this,table_p);
    unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>::
    ~unique_ptr((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                 *)0xe63aec);
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::~unique_ptr
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)0xe63af9);
    shared_ptr<duckdb::Binder,_true>::~shared_ptr((shared_ptr<duckdb::Binder,_true> *)0xe63b06);
  }
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalVacuum,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffeb0,
             (unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>_> *)
             in_stack_fffffffffffffea8);
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)0xe63b8a
            );
  unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::~unique_ptr
            ((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true> *)
             0xe63b97);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> LogicalVacuum::Deserialize(Deserializer &deserializer) {
	auto result = unique_ptr<LogicalVacuum>(new LogicalVacuum());

	auto tmp_info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	deserializer.ReadProperty(201, "column_id_map", result->column_id_map);

	result->info = unique_ptr_cast<ParseInfo, VacuumInfo>(std::move(tmp_info));
	auto &info = *result->info;
	if (info.has_table) {
		// deserialize the 'table'
		auto &context = deserializer.Get<ClientContext &>();
		auto binder = Binder::CreateBinder(context);
		auto bound_table = binder->Bind(*info.ref);
		if (bound_table->type != TableReferenceType::BASE_TABLE) {
			throw InvalidInputException("can only vacuum or analyze base tables");
		}
		auto ref = unique_ptr_cast<BoundTableRef, BoundBaseTableRef>(std::move(bound_table));
		auto &table = ref->table;
		result->SetTable(table);
		// FIXME: we should probably verify that the 'column_id_map' and 'columns' are the same on the bound table after
		// deserialization?
	}
	return std::move(result);
}